

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int handle_message(sockaddr_in addr,int from_id)

{
  FILE *pFVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  size_type sVar5;
  undefined8 uVar6;
  uint *puVar7;
  sockaddr_in addr_00;
  iterator iStack_18750;
  int ch;
  iterator __end1;
  iterator __begin1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range1;
  allocator aStack_18721;
  string asStack_18720 [32];
  ulong uStack_18700;
  size_t size_message;
  char message [100000];
  string local_40 [8];
  string str_addr;
  uint local_20;
  uchar uStack_1c;
  uchar uStack_1b;
  uchar uStack_1a;
  uchar uStack_19;
  int from_id_local;
  sockaddr_in addr_local;
  
  addr_local._0_8_ = addr.sin_zero;
  _uStack_1c = addr._0_8_;
  local_20 = from_id;
  sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                    (&children,(key_type *)&local_20);
  if ((sVar5 == 0) &&
     (((flag_root & 1U) != 0 || (((flag_root & 1U) == 0 && (local_20 != id_parent)))))) {
    addr_local.sin_zero[0] = '\0';
    addr_local.sin_zero[1] = '\0';
    addr_local.sin_zero[2] = '\0';
    addr_local.sin_zero[3] = '\0';
  }
  else {
    addr_00.sin_zero[0] = uStack_1c;
    addr_00.sin_zero[1] = uStack_1b;
    addr_00.sin_zero[2] = uStack_1a;
    addr_00.sin_zero[3] = uStack_19;
    addr_00.sin_zero[4] = (uchar)from_id_local;
    addr_00.sin_zero[5] = from_id_local._1_1_;
    addr_00.sin_zero[6] = from_id_local._2_1_;
    addr_00.sin_zero[7] = from_id_local._3_1_;
    addr_00._0_8_ = local_40;
    pack_address_abi_cxx11_(addr_00);
    pFVar1 = _stderr;
    uVar6 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"Message from: %s\n",uVar6);
    uVar3 = ntohl(*(uint32_t *)((long)buf + 8));
    uStack_18700 = (ulong)uVar3;
    strncpy((char *)&size_message,(char *)((long)buf + 0xc),uStack_18700);
    message[uStack_18700 - 8] = '\0';
    fprintf(_stderr,"%s\n",&size_message);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(asStack_18720,(char *)&size_message,&aStack_18721);
    std::__cxx11::string::operator=((string *)tosend_message_abi_cxx11_,asStack_18720);
    std::__cxx11::string::~string(asStack_18720);
    std::allocator<char>::~allocator((allocator<char> *)&aStack_18721);
    if (((flag_root & 1U) == 0) && (local_20 != id_parent)) {
      fprintf(_stderr,"Vajno!!! %d %d\n",(ulong)local_20,(ulong)(uint)id_parent);
      pFVar1 = _stderr;
      sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::size(&children);
      fprintf(pFVar1,anon_var_dwarf_11b43,sVar5);
      create_new_message(1,id_parent);
    }
    else {
      fprintf(_stderr,"No resend parent\n");
    }
    __end1 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(&children);
    iStack_18750 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(&children);
    while( true ) {
      bVar2 = std::operator!=(&__end1,&stack0xfffffffffffe78b0);
      if (!bVar2) break;
      puVar7 = (uint *)std::_Rb_tree_const_iterator<int>::operator*(&__end1);
      if (*puVar7 != local_20) {
        create_new_message(1,*puVar7);
      }
      std::_Rb_tree_const_iterator<int>::operator++(&__end1);
    }
    addr_local.sin_zero[0] = '\x01';
    addr_local.sin_zero[1] = '\0';
    addr_local.sin_zero[2] = '\0';
    addr_local.sin_zero[3] = '\0';
    std::__cxx11::string::~string(local_40);
  }
  iVar4._0_1_ = addr_local.sin_zero[0];
  iVar4._1_1_ = addr_local.sin_zero[1];
  iVar4._2_1_ = addr_local.sin_zero[2];
  iVar4._3_1_ = addr_local.sin_zero[3];
  return iVar4;
}

Assistant:

int handle_message(struct sockaddr_in addr, int from_id) {
    // if only on children or parent
    if (!children.count(from_id) && (flag_root || !flag_root && from_id != id_parent)) {
        return 0;
    }
    // ttl on new connector

    std::string str_addr = pack_address(addr);
    fprintf(stderr, "Message from: %s\n", str_addr.c_str());

    char message[MESSAGE_MAX_SIZE];
    size_t size_message = ntohl(((uint32_t*)buf)[2]);
    strncpy(message, (char*)buf + 3 * sizeof(int), size_message);
    message[size_message] = '\0';
    fprintf(stderr, "%s\n", message);

    tosend_message = std::string(message);
    if (!flag_root && from_id != id_parent) {
        fprintf(stderr, "Vajno!!! %d %d\n", from_id, id_parent);
        fprintf(stderr, "Сhildren size: %ld\n", children.size());
        create_new_message(MSG, id_parent);
    }
    else {
        fprintf(stderr, "No resend parent\n");
    }
    for (auto ch : children) {
        if (ch != from_id) {
            create_new_message(MSG, ch);
        }
    }
    return 1;
}